

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeComputeTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::invalid_maximum_work_group_sizes
               (NegativeTestContext *ctx)

{
  ostringstream *this;
  RenderContext *renderCtx;
  bool bVar1;
  ContextType ctxType;
  int iVar2;
  ostream *poVar3;
  ProgramSources *sources;
  long lVar4;
  allocator<char> local_43d;
  GLint maxWorkGroupSizeZ;
  GLint maxWorkGroupSizeY;
  GLint maxWorkGroupSizeX;
  char *local_430;
  GLint maxWorkGroupInvocations;
  ComputeSource compSource;
  ShaderProgram program;
  undefined1 local_328 [176];
  undefined8 local_278;
  undefined1 uStack_270;
  undefined7 uStack_26f;
  undefined1 uStack_268;
  undefined8 uStack_267;
  ostringstream compShaderSource;
  
  glu::CallLogWrapper::glGetIntegeri_v(&ctx->super_CallLogWrapper,0x91bf,0,&maxWorkGroupSizeX);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glGetIntegeri_v(&ctx->super_CallLogWrapper,0x91bf,1,&maxWorkGroupSizeY);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glGetIntegeri_v(&ctx->super_CallLogWrapper,0x91bf,2,&maxWorkGroupSizeZ);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glGetIntegerv(&ctx->super_CallLogWrapper,0x90eb,&maxWorkGroupInvocations);
  NegativeTestContext::expectError(ctx,0);
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  local_430 = glu::getGLSLVersionDeclaration(bVar1 | GLSL_VERSION_310_ES);
  if (NegativeTestShared::(anonymous_namespace)::
      invalid_maximum_work_group_sizes(deqp::gles31::Functional::NegativeTestShared::NegativeTestContext&)
      ::localWorkGroupSizeCases == '\0') {
    iVar2 = __cxa_guard_acquire(&NegativeTestShared::(anonymous_namespace)::
                                 invalid_maximum_work_group_sizes(deqp::gles31::Functional::NegativeTestShared::NegativeTestContext&)
                                 ::localWorkGroupSizeCases);
    if (iVar2 != 0) {
      invalid_maximum_work_group_sizes::localWorkGroupSizeCases[0].x = maxWorkGroupSizeX + 1;
      invalid_maximum_work_group_sizes::localWorkGroupSizeCases[0]._4_8_ = &DAT_100000001;
      invalid_maximum_work_group_sizes::localWorkGroupSizeCases[1].y = maxWorkGroupSizeY + 1;
      invalid_maximum_work_group_sizes::localWorkGroupSizeCases._20_8_ = &DAT_100000001;
      invalid_maximum_work_group_sizes::localWorkGroupSizeCases[2].z = maxWorkGroupSizeZ + 1;
      invalid_maximum_work_group_sizes::localWorkGroupSizeCases[3].x = maxWorkGroupSizeX;
      invalid_maximum_work_group_sizes::localWorkGroupSizeCases[3].y = maxWorkGroupSizeY;
      invalid_maximum_work_group_sizes::localWorkGroupSizeCases[3].z = maxWorkGroupSizeZ;
      invalid_maximum_work_group_sizes::localWorkGroupSizeCases[1].x = 1;
      invalid_maximum_work_group_sizes::localWorkGroupSizeCases[2].y = 1;
      __cxa_guard_release(&NegativeTestShared::(anonymous_namespace)::
                           invalid_maximum_work_group_sizes(deqp::gles31::Functional::NegativeTestShared::NegativeTestContext&)
                           ::localWorkGroupSizeCases);
    }
  }
  this = (ostringstream *)(local_328 + 8);
  for (lVar4 = 8; lVar4 != 0x38; lVar4 = lVar4 + 0xc) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&compShaderSource);
    poVar3 = std::operator<<((ostream *)&compShaderSource,local_430);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"layout(local_size_x = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(lVar4 + 0x1f56268));
    poVar3 = std::operator<<(poVar3,", local_size_y = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(lVar4 + 0x1f5626c));
    poVar3 = std::operator<<(poVar3,", local_size_z = ");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,*(int *)((long)&invalid_maximum_work_group_sizes::
                                               localWorkGroupSizeCases[0].x + lVar4));
    poVar3 = std::operator<<(poVar3,") in;\n");
    poVar3 = std::operator<<(poVar3,"void main (void)\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    std::operator<<(poVar3,"}\n");
    std::__cxx11::stringbuf::str();
    glu::ComputeSource::ComputeSource
              ((ComputeSource *)&compSource.super_ShaderSource,(string *)local_328);
    std::__cxx11::string::~string((string *)local_328);
    renderCtx = ctx->m_renderCtx;
    memset((MessageBuilder *)local_328,0,0xac);
    local_278 = 0;
    uStack_270 = 0;
    uStack_26f = 0;
    uStack_268 = 0;
    uStack_267 = 0;
    sources = glu::ProgramSources::operator<<
                        ((ProgramSources *)local_328,&compSource.super_ShaderSource);
    glu::ShaderProgram::ShaderProgram(&program,renderCtx,sources);
    glu::ProgramSources::~ProgramSources((ProgramSources *)local_328);
    if (lVar4 == 0x2c) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_328,
                 "A compile time or link error is generated if the maximum number of invocations in a single local work group (product of the three dimensions) is greater than GL_MAX_COMPUTE_WORK_GROUP_INVOCATIONS."
                 ,&local_43d);
      NegativeTestContext::beginSection(ctx,(string *)local_328);
      std::__cxx11::string::~string((string *)local_328);
      glu::operator<<((ctx->super_CallLogWrapper).m_log,&program);
      if ((program.m_program.m_info.linkOk == true) &&
         (((*program.m_shaders[5].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
             _M_impl.super__Vector_impl_data._M_start)->m_info).compileOk == true)) {
        local_328._0_8_ = (ctx->super_CallLogWrapper).m_log;
        std::__cxx11::ostringstream::ostringstream(this);
        std::operator<<((ostream *)this,"Program was not expected to compile or link.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_328,"Program was not expected to compile or link.",&local_43d);
        NegativeTestContext::fail(ctx,(string *)local_328);
        std::__cxx11::string::~string((string *)local_328);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_328,
                 "A compile time error is generated if the fixed local group size of the shader in any dimension is greater than the maximum supported."
                 ,&local_43d);
      NegativeTestContext::beginSection(ctx,(string *)local_328);
      std::__cxx11::string::~string((string *)local_328);
      verifyCompileError(ctx,&program,SHADERTYPE_COMPUTE);
    }
    NegativeTestContext::endSection(ctx);
    glu::ShaderProgram::~ShaderProgram(&program);
    std::__cxx11::string::~string((string *)&compSource.super_ShaderSource.source);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&compShaderSource);
  }
  return;
}

Assistant:

void invalid_maximum_work_group_sizes (NegativeTestContext& ctx)
{
	GLint maxWorkGroupSizeX;
	ctx.glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_SIZE, (GLuint)0, &maxWorkGroupSizeX);
	ctx.expectError(GL_NO_ERROR);

	GLint maxWorkGroupSizeY;
	ctx.glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_SIZE, (GLuint)1, &maxWorkGroupSizeY);
	ctx.expectError(GL_NO_ERROR);

	GLint maxWorkGroupSizeZ;
	ctx.glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_SIZE, (GLuint)2, &maxWorkGroupSizeZ);
	ctx.expectError(GL_NO_ERROR);

	GLint maxWorkGroupInvocations;
	ctx.glGetIntegerv(GL_MAX_COMPUTE_WORK_GROUP_INVOCATIONS, &maxWorkGroupInvocations);
	ctx.expectError(GL_NO_ERROR);

	DE_ASSERT((maxWorkGroupSizeX * maxWorkGroupSizeY * maxWorkGroupSizeZ) > maxWorkGroupInvocations );

	const bool				isES32			= glu::contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	const char* const		shaderVersion	= isES32
											? getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES)
											: getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);

	static const struct
	{
		GLint x;
		GLint y;
		GLint z;
	} localWorkGroupSizeCases[] =
	{
		{	maxWorkGroupSizeX+1,	1,						1						},
		{	1,						maxWorkGroupSizeY+1,	1						},
		{	1,						1,						maxWorkGroupSizeZ+1		},
		{	maxWorkGroupSizeX,		maxWorkGroupSizeY,		maxWorkGroupSizeZ		},
	};

	for (int testCase = 0; testCase < DE_LENGTH_OF_ARRAY(localWorkGroupSizeCases); ++testCase)
	{
		std::ostringstream compShaderSource;

		compShaderSource	<<	shaderVersion << "\n"
							<<	"layout(local_size_x = " << localWorkGroupSizeCases[testCase].x << ", local_size_y = " << localWorkGroupSizeCases[testCase].y << ", local_size_z = " << localWorkGroupSizeCases[testCase].z << ") in;\n"
							<<	"void main (void)\n"
							<<	"{\n"
							<<	"}\n";

		const glu::ComputeSource	compSource(compShaderSource.str());
		glu::ShaderProgram			program(ctx.getRenderContext(), glu::ProgramSources() << compSource);

		if (testCase == DE_LENGTH_OF_ARRAY(localWorkGroupSizeCases)-1)
		{
			bool testFailed = false;
			ctx.beginSection("A compile time or link error is generated if the maximum number of invocations in a single local work group (product of the three dimensions) is greater than GL_MAX_COMPUTE_WORK_GROUP_INVOCATIONS.");

			ctx.getLog() << program;
			testFailed = (program.getProgramInfo().linkOk) && (program.getShaderInfo(glu::SHADERTYPE_COMPUTE).compileOk);

			if (testFailed)
			{
				const char* const message("Program was not expected to compile or link.");
				ctx.getLog() << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;
				ctx.fail(message);
			}
		}
		else
		{
			ctx.beginSection("A compile time error is generated if the fixed local group size of the shader in any dimension is greater than the maximum supported.");
			verifyCompileError(ctx, program, glu::SHADERTYPE_COMPUTE);
		}

		ctx.endSection();
	}
}